

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake.cc
# Opt level: O2

ssl_verify_result_t bssl::ssl_reverify_peer_cert(SSL_HANDSHAKE *hs,bool send_alert)

{
  SSL *ssl;
  _func_ssl_verify_result_t_SSL_ptr_uint8_t_ptr *p_Var1;
  ssl_verify_result_t sVar2;
  uint8_t alert;
  
  ssl = hs->ssl;
  if ((ssl->s3->established_session)._M_t.
      super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl != (ssl_session_st *)0x0) {
    __assert_fail("ssl->s3->established_session == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake.cc"
                  ,0x149,
                  "enum ssl_verify_result_t bssl::ssl_reverify_peer_cert(SSL_HANDSHAKE *, bool)");
  }
  if (hs->config->verify_mode != '\0') {
    alert = '.';
    p_Var1 = hs->config->custom_verify_callback;
    if ((p_Var1 != (_func_ssl_verify_result_t_SSL_ptr_uint8_t_ptr *)0x0) &&
       (sVar2 = (*p_Var1)(ssl,&alert), sVar2 != ssl_verify_invalid)) {
      return sVar2;
    }
    ERR_put_error(0x10,0,0x7d,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake.cc"
                  ,0x153);
    if (send_alert) {
      ssl_send_alert(ssl,2,(uint)alert);
    }
    return ssl_verify_invalid;
  }
  __assert_fail("hs->config->verify_mode != SSL_VERIFY_NONE",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake.cc"
                ,0x14a,
                "enum ssl_verify_result_t bssl::ssl_reverify_peer_cert(SSL_HANDSHAKE *, bool)");
}

Assistant:

enum ssl_verify_result_t ssl_reverify_peer_cert(SSL_HANDSHAKE *hs,
                                                bool send_alert) {
  SSL *const ssl = hs->ssl;
  assert(ssl->s3->established_session == nullptr);
  assert(hs->config->verify_mode != SSL_VERIFY_NONE);

  uint8_t alert = SSL_AD_CERTIFICATE_UNKNOWN;
  enum ssl_verify_result_t ret = ssl_verify_invalid;
  if (hs->config->custom_verify_callback != nullptr) {
    ret = hs->config->custom_verify_callback(ssl, &alert);
  }

  if (ret == ssl_verify_invalid) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_CERTIFICATE_VERIFY_FAILED);
    if (send_alert) {
      ssl_send_alert(ssl, SSL3_AL_FATAL, alert);
    }
  }

  return ret;
}